

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

void __thiscall picojson::value::value(value *this,int type,bool param_2)

{
  string *psVar1;
  bool param_2_local;
  int type_local;
  value *this_local;
  
  this->type_ = type;
  switch(type) {
  case 1:
    (this->u_).boolean_ = false;
    break;
  case 2:
    (this->u_).number_ = 0.0;
    break;
  case 3:
    psVar1 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)psVar1);
    (this->u_).string_ = psVar1;
    break;
  case 4:
    psVar1 = (string *)operator_new(0x18);
    memset(psVar1,0,0x18);
    std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)psVar1);
    (this->u_).string_ = psVar1;
    break;
  case 5:
    psVar1 = (string *)operator_new(0x30);
    memset(psVar1,0,0x30);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
           *)psVar1);
    (this->u_).string_ = psVar1;
  }
  return;
}

Assistant:

inline value::value(int type, bool) : type_(type) {
    switch (type) {
#define INIT(p, v) case p##type: u_.p = v; break
      INIT(boolean_, false);
      INIT(number_, 0.0);
#ifdef PICOJSON_USE_INT64
      INIT(int64_, 0);
#endif
      INIT(string_, new std::string());
      INIT(array_, new array());
      INIT(object_, new object());
#undef INIT
    default: break;
    }
  }